

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam-core.c
# Opt level: O1

void la_miam_errors_format_text(la_vstring *vstr,uint32_t err,int indent)

{
  void *pvVar1;
  uint id;
  uint32_t i;
  int iVar2;
  
  iVar2 = 0;
  do {
    id = 1 << ((byte)iVar2 & 0x1f) & err;
    if (id != 0) {
      pvVar1 = la_dict_search(la_miam_errors_format_text::la_miam_error_messages,id);
      if (pvVar1 == (void *)0x0) {
        la_vstring_append_sprintf(vstr,"%*s-- Unknown error (%u)\n",(ulong)(uint)indent,"",err);
      }
      else {
        la_vstring_append_sprintf(vstr,"%*s-- %s\n",(ulong)(uint)indent,"",pvVar1);
      }
    }
    iVar2 = iVar2 + 1;
  } while (iVar2 != 0x20);
  return;
}

Assistant:

static void la_miam_errors_format_text(la_vstring *vstr, uint32_t err, int indent) {
	static la_dict const la_miam_error_messages[] = {
		{ .id = LA_MIAM_ERR_SUCCESS,                    .val = "No error" },
		{ .id = LA_MIAM_ERR_HDR_PDU_TYPE_UNKNOWN,       .val = "Unknown PDU type" },
		{ .id = LA_MIAM_ERR_HDR_PDU_VERSION_UNKNOWN,    .val = "Unsupported MIAM version" },
		{ .id = LA_MIAM_ERR_HDR_TRUNCATED,              .val = "Header truncated" },
		{ .id = LA_MIAM_ERR_HDR_APP_TYPE_UNKNOWN,       .val = "Unknown application type" },
		{ .id = LA_MIAM_ERR_BODY_TRUNCATED,             .val = "Message truncated" },
		{ .id = LA_MIAM_ERR_BODY_INFLATE_FAILED,        .val = "Decompression failed" },
		{ .id = LA_MIAM_ERR_BODY_COMPR_UNSUPPORTED,     .val = "Unsupported compression algorithm" },
		{ .id = LA_MIAM_ERR_BODY_CRC_FAILED,            .val = "CRC check failed" },
		{ .id = 0,                                      .val = NULL }
	};
	la_assert(vstr != NULL);
	la_assert(indent >= 0);
	for(uint32_t i = 0; i < 32; i++) {
		if((err & (1 << i)) != 0) {
			char *errmsg = la_dict_search(la_miam_error_messages, (int)(err & (1 << i)));
			if(errmsg != NULL) {
				LA_ISPRINTF(vstr, indent, "-- %s\n", errmsg);
			} else {
				LA_ISPRINTF(vstr, indent, "-- Unknown error (%u)\n", err);
			}
		}
	}
}